

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

void ImPlot::PlotStemsEx<ImPlot::GetterXsYs<long_long>,ImPlot::GetterXsYRef<long_long>>
               (char *label_id,GetterXsYs<long_long> *get_mark,GetterXsYRef<long_long> *get_base)

{
  TransformerLinLin transformer;
  ImPlotContext *pIVar1;
  bool bVar2;
  ImU32 IVar3;
  ImU32 col_mk_fill;
  ImDrawList *DrawList;
  int i;
  int iVar4;
  ImPlotMarker marker;
  ImPlotPoint local_40;
  
  bVar2 = BeginItem(label_id,0);
  if (bVar2) {
    if (GImPlot->FitThisFrame == true) {
      for (iVar4 = 0; iVar4 < get_base->Count; iVar4 = iVar4 + 1) {
        local_40 = GetterXsYs<long_long>::operator()(get_mark,iVar4);
        FitPoint(&local_40);
        local_40 = GetterXsYRef<long_long>::operator()(get_base,iVar4);
        FitPoint(&local_40);
      }
    }
    pIVar1 = GImPlot;
    DrawList = GetPlotDrawList();
    if ((pIVar1->NextItemData).RenderLine == true) {
      IVar3 = ImGui::GetColorU32((pIVar1->NextItemData).Colors);
      iVar4 = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[iVar4]) {
      case 0:
        local_40.x._0_4_ = iVar4;
        RenderLineSegments<ImPlot::GetterXsYs<long_long>,ImPlot::GetterXsYRef<long_long>,ImPlot::TransformerLinLin>
                  (get_mark,get_base,(TransformerLinLin *)&local_40,DrawList,
                   (pIVar1->NextItemData).LineWeight,IVar3);
        break;
      case 1:
        local_40.x._0_4_ = iVar4;
        RenderLineSegments<ImPlot::GetterXsYs<long_long>,ImPlot::GetterXsYRef<long_long>,ImPlot::TransformerLogLin>
                  (get_mark,get_base,(TransformerLogLin *)&local_40,DrawList,
                   (pIVar1->NextItemData).LineWeight,IVar3);
        break;
      case 2:
        local_40.x._0_4_ = iVar4;
        RenderLineSegments<ImPlot::GetterXsYs<long_long>,ImPlot::GetterXsYRef<long_long>,ImPlot::TransformerLinLog>
                  (get_mark,get_base,(TransformerLinLog *)&local_40,DrawList,
                   (pIVar1->NextItemData).LineWeight,IVar3);
        break;
      case 3:
        local_40.x._0_4_ = iVar4;
        RenderLineSegments<ImPlot::GetterXsYs<long_long>,ImPlot::GetterXsYRef<long_long>,ImPlot::TransformerLogLog>
                  (get_mark,get_base,(TransformerLogLog *)&local_40,DrawList,
                   (pIVar1->NextItemData).LineWeight,IVar3);
      }
    }
    iVar4 = (pIVar1->NextItemData).Marker;
    marker = 0;
    if (iVar4 != -1) {
      marker = iVar4;
    }
    IVar3 = ImGui::GetColorU32((pIVar1->NextItemData).Colors + 2);
    col_mk_fill = ImGui::GetColorU32((pIVar1->NextItemData).Colors + 3);
    transformer.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
    switch(GImPlot->Scales[transformer.YAxis]) {
    case 0:
      RenderMarkers<ImPlot::TransformerLinLin,ImPlot::GetterXsYs<long_long>>
                (*get_mark,transformer,DrawList,marker,(pIVar1->NextItemData).MarkerSize,
                 (pIVar1->NextItemData).RenderMarkerLine,IVar3,(pIVar1->NextItemData).MarkerWeight,
                 (pIVar1->NextItemData).RenderMarkerFill,col_mk_fill);
      break;
    case 1:
      RenderMarkers<ImPlot::TransformerLogLin,ImPlot::GetterXsYs<long_long>>
                (*get_mark,(TransformerLogLin)transformer.YAxis,DrawList,marker,
                 (pIVar1->NextItemData).MarkerSize,(pIVar1->NextItemData).RenderMarkerLine,IVar3,
                 (pIVar1->NextItemData).MarkerWeight,(pIVar1->NextItemData).RenderMarkerFill,
                 col_mk_fill);
      break;
    case 2:
      RenderMarkers<ImPlot::TransformerLinLog,ImPlot::GetterXsYs<long_long>>
                (*get_mark,(TransformerLinLog)transformer.YAxis,DrawList,marker,
                 (pIVar1->NextItemData).MarkerSize,(pIVar1->NextItemData).RenderMarkerLine,IVar3,
                 (pIVar1->NextItemData).MarkerWeight,(pIVar1->NextItemData).RenderMarkerFill,
                 col_mk_fill);
      break;
    case 3:
      RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterXsYs<long_long>>
                (*get_mark,(TransformerLogLog)transformer.YAxis,DrawList,marker,
                 (pIVar1->NextItemData).MarkerSize,(pIVar1->NextItemData).RenderMarkerLine,IVar3,
                 (pIVar1->NextItemData).MarkerWeight,(pIVar1->NextItemData).RenderMarkerFill,
                 col_mk_fill);
    }
    EndItem();
  }
  return;
}

Assistant:

inline void PlotStemsEx(const char* label_id, const GetterM& get_mark, const GetterB& get_base) {
    if (BeginItem(label_id, ImPlotCol_Line)) {
        if (FitThisFrame()) {
            for (int i = 0; i < get_base.Count; ++i) {
                FitPoint(get_mark(i));
                FitPoint(get_base(i));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        // render stems
        if (s.RenderLine) {
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderLineSegments(get_mark, get_base, TransformerLinLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLin: RenderLineSegments(get_mark, get_base, TransformerLogLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LinLog: RenderLineSegments(get_mark, get_base, TransformerLinLog(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLog: RenderLineSegments(get_mark, get_base, TransformerLogLog(), DrawList, s.LineWeight, col_line); break;
            }
        }
        // render markers
        ImPlotMarker marker = s.Marker == ImPlotMarker_None ? ImPlotMarker_Circle : s.Marker;
        if (marker != ImPlotMarker_None) {
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerOutline]);
            const ImU32 col_fill = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerFill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderMarkers(get_mark, TransformerLinLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLin: RenderMarkers(get_mark, TransformerLogLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LinLog: RenderMarkers(get_mark, TransformerLinLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLog: RenderMarkers(get_mark, TransformerLogLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
            }
        }
        EndItem();
    }
}